

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O3

bool __thiscall
xercesc_4_0::DTDScanner::scanEntityDef(DTDScanner *this,DTDEntityDecl *decl,bool isPEDecl)

{
  short *psVar1;
  XMLBufferMgr *pXVar2;
  XMLBufferMgr *this_00;
  XMLBufferMgr *this_01;
  ReaderMgr *pRVar3;
  bool bVar4;
  bool bVar5;
  XMLCh XVar6;
  int iVar7;
  XMLBuffer *pXVar8;
  undefined4 extraout_var;
  long lVar9;
  XMLBuffer *sysIdToFill;
  undefined4 extraout_var_00;
  XMLCh *pXVar10;
  undefined4 extraout_var_02;
  XMLBuffer *toFill;
  undefined4 extraout_var_03;
  XMLCh *pXVar11;
  MemoryManager *pMVar12;
  XMLCh *__src;
  size_t sVar13;
  XMLBufBid bbName;
  XMLBufBid bbSysId;
  XMLBufBid bbPubId;
  LastExtEntityInfo lastInfo;
  LastExtEntityInfo local_50;
  undefined4 extraout_var_01;
  
  XVar6 = ReaderMgr::peekNextChar(this->fReaderMgr);
  if ((XVar6 == L'\'') || (XVar6 = ReaderMgr::peekNextChar(this->fReaderMgr), XVar6 == L'\"')) {
    pXVar2 = this->fBufMgr;
    pXVar8 = XMLBufferMgr::bidOnBuffer(pXVar2);
    local_50.systemId = (XMLCh *)pXVar8;
    local_50.publicId = (XMLCh *)pXVar2;
    bVar4 = scanEntityLiteral(this,pXVar8);
    if (bVar4) {
      pXVar11 = pXVar8->fBuffer;
      pXVar11[pXVar8->fIndex] = L'\0';
      if ((decl->super_XMLEntityDecl).fValue != (XMLCh *)0x0) {
        (*((decl->super_XMLEntityDecl).fMemoryManager)->_vptr_MemoryManager[4])();
      }
      pMVar12 = (decl->super_XMLEntityDecl).fMemoryManager;
      sVar13 = 0;
      do {
        psVar1 = (short *)((long)pXVar11 + sVar13);
        sVar13 = sVar13 + 2;
      } while (*psVar1 != 0);
      iVar7 = (*pMVar12->_vptr_MemoryManager[3])(pMVar12,sVar13);
      memcpy((XMLCh *)CONCAT44(extraout_var,iVar7),pXVar11,sVar13);
      (decl->super_XMLEntityDecl).fValue = (XMLCh *)CONCAT44(extraout_var,iVar7);
      lVar9 = 0;
      do {
        psVar1 = (short *)((long)pXVar11 + lVar9);
        lVar9 = lVar9 + 2;
      } while (*psVar1 != 0);
      (decl->super_XMLEntityDecl).fValueLen = (lVar9 >> 1) - 1;
    }
    XMLBufferMgr::releaseBuffer(pXVar2,pXVar8);
    return bVar4;
  }
  pXVar2 = this->fBufMgr;
  pXVar8 = XMLBufferMgr::bidOnBuffer(pXVar2);
  this_00 = this->fBufMgr;
  sysIdToFill = XMLBufferMgr::bidOnBuffer(this_00);
  bVar4 = scanId(this,pXVar8,sysIdToFill,IDType_External);
  if (!bVar4) {
    bVar4 = false;
    goto LAB_00303fa5;
  }
  (decl->super_XMLEntityDecl).fIsExternal = true;
  ReaderMgr::getLastExtEntityInfo(this->fReaderMgr,&local_50);
  pXVar11 = pXVar8->fBuffer;
  pXVar11[pXVar8->fIndex] = L'\0';
  pXVar10 = sysIdToFill->fBuffer;
  pXVar10[sysIdToFill->fIndex] = L'\0';
  XVar6 = *pXVar11;
  __src = (XMLCh *)0x0;
  if (XVar6 != L'\0') {
    __src = pXVar11;
  }
  if ((decl->super_XMLEntityDecl).fPublicId != (XMLCh *)0x0) {
    (*((decl->super_XMLEntityDecl).fMemoryManager)->_vptr_MemoryManager[4])();
  }
  if (XVar6 == L'\0') {
    (decl->super_XMLEntityDecl).fPublicId = (XMLCh *)0x0;
LAB_00303d37:
    pXVar11 = (XMLCh *)0x0;
    if (*pXVar10 != L'\0') {
      pXVar11 = pXVar10;
    }
  }
  else {
    pMVar12 = (decl->super_XMLEntityDecl).fMemoryManager;
    sVar13 = (long)pXVar11 - (long)__src;
    do {
      sVar13 = sVar13 + 2;
      XVar6 = *pXVar11;
      pXVar11 = pXVar11 + 1;
    } while (XVar6 != L'\0');
    iVar7 = (*pMVar12->_vptr_MemoryManager[3])(pMVar12,sVar13);
    memcpy((XMLCh *)CONCAT44(extraout_var_00,iVar7),__src,sVar13);
    (decl->super_XMLEntityDecl).fPublicId = (XMLCh *)CONCAT44(extraout_var_00,iVar7);
    if (pXVar10 != (XMLCh *)0x0) goto LAB_00303d37;
    pXVar11 = (XMLCh *)0x0;
  }
  pMVar12 = (decl->super_XMLEntityDecl).fMemoryManager;
  if ((decl->super_XMLEntityDecl).fSystemId != (XMLCh *)0x0) {
    (*pMVar12->_vptr_MemoryManager[4])();
    pMVar12 = (decl->super_XMLEntityDecl).fMemoryManager;
  }
  if (pXVar11 == (XMLCh *)0x0) {
    pXVar10 = (XMLCh *)0x0;
  }
  else {
    sVar13 = 0;
    do {
      psVar1 = (short *)((long)pXVar11 + sVar13);
      sVar13 = sVar13 + 2;
    } while (*psVar1 != 0);
    iVar7 = (*pMVar12->_vptr_MemoryManager[3])(pMVar12,sVar13);
    pXVar10 = (XMLCh *)CONCAT44(extraout_var_01,iVar7);
    memcpy(pXVar10,pXVar11,sVar13);
  }
  (decl->super_XMLEntityDecl).fSystemId = pXVar10;
  pXVar11 = (XMLCh *)0x0;
  if ((local_50.systemId != (XMLCh *)0x0) && (*local_50.systemId != L'\0')) {
    pXVar11 = local_50.systemId;
  }
  pMVar12 = (decl->super_XMLEntityDecl).fMemoryManager;
  if ((decl->super_XMLEntityDecl).fBaseURI != (XMLCh *)0x0) {
    (*pMVar12->_vptr_MemoryManager[4])();
    pMVar12 = (decl->super_XMLEntityDecl).fMemoryManager;
  }
  if (pXVar11 == (XMLCh *)0x0) {
    pXVar10 = (XMLCh *)0x0;
  }
  else {
    sVar13 = 0;
    do {
      psVar1 = (short *)((long)pXVar11 + sVar13);
      sVar13 = sVar13 + 2;
    } while (*psVar1 != 0);
    iVar7 = (*pMVar12->_vptr_MemoryManager[3])(pMVar12,sVar13);
    pXVar10 = (XMLCh *)CONCAT44(extraout_var_02,iVar7);
    memcpy(pXVar10,pXVar11,sVar13);
  }
  (decl->super_XMLEntityDecl).fBaseURI = pXVar10;
  bVar5 = checkForPERef(this,false,true);
  if (isPEDecl) {
    bVar4 = true;
    if (!bVar5) goto LAB_00303fa5;
    bVar4 = XMLReader::skippedString(this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgNDATAString);
    if (bVar4) {
      XMLScanner::emitError(this->fScanner,NDATANotValidForPE);
    }
  }
  XVar6 = ReaderMgr::peekNextChar(this->fReaderMgr);
  bVar4 = true;
  if (XVar6 != L'>') {
    if (!bVar5) {
      XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
    }
    bVar4 = XMLReader::skippedString(this->fReaderMgr->fCurReader,(XMLCh *)XMLUni::fgNDATAString);
    if (!bVar4) {
      XMLScanner::emitError(this->fScanner,ExpectedNDATA);
    }
    bVar4 = checkForPERef(this,false,true);
    if (!bVar4) {
      XMLScanner::emitError(this->fScanner,ExpectedWhitespace);
    }
    this_01 = this->fBufMgr;
    toFill = XMLBufferMgr::bidOnBuffer(this_01);
    pRVar3 = this->fReaderMgr;
    toFill->fIndex = 0;
    bVar4 = XMLReader::getName(pRVar3->fCurReader,toFill,false);
    if (bVar4) {
      pXVar11 = toFill->fBuffer;
      pXVar11[toFill->fIndex] = L'\0';
      if ((decl->super_XMLEntityDecl).fNotationName != (XMLCh *)0x0) {
        (*((decl->super_XMLEntityDecl).fMemoryManager)->_vptr_MemoryManager[4])();
      }
      pMVar12 = (decl->super_XMLEntityDecl).fMemoryManager;
      sVar13 = 0;
      do {
        psVar1 = (short *)((long)pXVar11 + sVar13);
        sVar13 = sVar13 + 2;
      } while (*psVar1 != 0);
      iVar7 = (*pMVar12->_vptr_MemoryManager[3])(pMVar12,sVar13);
      memcpy((XMLCh *)CONCAT44(extraout_var_03,iVar7),pXVar11,sVar13);
      (decl->super_XMLEntityDecl).fNotationName = (XMLCh *)CONCAT44(extraout_var_03,iVar7);
    }
    else {
      XMLScanner::emitError(this->fScanner,ExpectedNotationName);
    }
    XMLBufferMgr::releaseBuffer(this_01,toFill);
  }
LAB_00303fa5:
  XMLBufferMgr::releaseBuffer(this_00,sysIdToFill);
  XMLBufferMgr::releaseBuffer(pXVar2,pXVar8);
  return bVar4;
}

Assistant:

bool DTDScanner::scanEntityDef(DTDEntityDecl& decl, const bool isPEDecl)
{
    // Its got to be an entity literal
    if (fReaderMgr->lookingAtChar(chSingleQuote)
    ||  fReaderMgr->lookingAtChar(chDoubleQuote))
    {
        // Get a buffer for the literal
        XMLBufBid bbValue(fBufMgr);

        if (!scanEntityLiteral(bbValue.getBuffer()))
            return false;

        // Set it on the entity decl
        decl.setValue(bbValue.getRawBuffer());
        return true;
    }

    //
    //  Its got to be an external entity, so there must be an external id.
    //  Get buffers for them and scan an external id into them.
    //
    XMLBufBid bbPubId(fBufMgr);
    XMLBufBid bbSysId(fBufMgr);
    if (!scanId(bbPubId.getBuffer(), bbSysId.getBuffer(), IDType_External))
        return false;

    decl.setIsExternal(true);
    ReaderMgr::LastExtEntityInfo lastInfo;
    fReaderMgr->getLastExtEntityInfo(lastInfo);

    // Fill in the id fields of the decl with the info we got
    const XMLCh* publicId = bbPubId.getRawBuffer();
    const XMLCh* systemId = bbSysId.getRawBuffer();
    decl.setPublicId((publicId && *publicId) ? publicId : 0);
    decl.setSystemId((systemId && *systemId) ? systemId : 0);
    decl.setBaseURI((lastInfo.systemId && *lastInfo.systemId) ? lastInfo.systemId : 0);

    // If its a PE decl, we are done
    bool gotSpaces = checkForPERef(false, true);
    if (isPEDecl)
    {
        //
        //  Check for a common error here. NDATA is not allowed for PEs
        //  so check for the NDATA string. If found give a nice meaningful
        //  error and continue parsing to eat the NDATA text.
        //
        if (gotSpaces)
        {
            if (fReaderMgr->skippedString(XMLUni::fgNDATAString))
                fScanner->emitError(XMLErrs::NDATANotValidForPE);
        }
         else
        {
            return true;
        }
    }

    // If looking at close angle now, we are done
    if (fReaderMgr->lookingAtChar(chCloseAngle))
        return true;

    // Else we had to have seem the whitespace
    if (!gotSpaces)
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // We now have to see a notation data string
    if (!fReaderMgr->skippedString(XMLUni::fgNDATAString))
        fScanner->emitError(XMLErrs::ExpectedNDATA);

    // Space is required here, but try to go on if not
    if (!checkForPERef(false, true))
        fScanner->emitError(XMLErrs::ExpectedWhitespace);

    // Get a name
    XMLBufBid bbName(fBufMgr);
    if (!fReaderMgr->getName(bbName.getBuffer()))
    {
        fScanner->emitError(XMLErrs::ExpectedNotationName);
        return false;
    }

    // Set the decl's notation name
    decl.setNotationName(bbName.getRawBuffer());

    return true;
}